

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseExpr(WastParser *this,ExprList *exprs)

{
  Token *pTVar1;
  int *piVar2;
  Expr *pEVar3;
  long *plVar4;
  _Head_base<0UL,_wabt::Expr_*,_false> _Var5;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> uVar6;
  bool bVar7;
  TokenType TVar8;
  Result RVar9;
  Result RVar10;
  ExprList *pEVar11;
  undefined8 uVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  Token local_3c0;
  Token local_370;
  Token local_320;
  Token local_2d0;
  Token local_280;
  Token local_230;
  Token local_1e0;
  Token local_190;
  Token local_140;
  _Head_base<0UL,_wabt::Expr_*,_false> local_f0;
  _Head_base<0UL,_wabt::Expr_*,_false> local_e8;
  _Head_base<0UL,_wabt::Expr_*,_false> local_e0;
  _Head_base<0UL,_wabt::Expr_*,_false> local_d8;
  _Head_base<0UL,_wabt::Expr_*,_false> local_d0;
  undefined1 auStack_c8 [8];
  Location loc;
  ExprList cond;
  _Head_base<0UL,_wabt::Expr_*,_false> _Stack_58;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> expr;
  allocator_type local_39;
  IfExceptExpr *local_38;
  unique_ptr<wabt::IfExceptExpr,_std::default_delete<wabt::IfExceptExpr>_> expr_2;
  
  TVar8 = Peek(this,0);
  RVar10.enum_ = Error;
  if (TVar8 != Lpar) {
    return (Result)Error;
  }
  TVar8 = Peek(this,1);
  if ((0x33 < TVar8 - AtomicLoad) ||
     ((0xdfffffd33df7fU >> ((ulong)(TVar8 - AtomicLoad) & 0x3f) & 1) == 0)) {
    pTVar1 = (Token *)((long)&loc.field_1 + 8);
    GetToken(pTVar1,this);
    loc.filename.size_ = (size_type)cond.last_;
    loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)cond.size_;
    auStack_c8 = (undefined1  [8])loc.field_1._8_8_;
    loc.filename.data_ = (char *)cond.first_;
    Token::~Token(pTVar1);
    TVar8 = Peek(this,1);
    if ((int)TVar8 < 0x40) {
      if (TVar8 != Block) {
        if (TVar8 != IfExcept) {
LAB_00f6d7f9:
          __assert_fail("!\"ParseExpr should only be called when IsExpr() is true\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/wast-parser.cc"
                        ,0x830,"Result wabt::WastParser::ParseExpr(ExprList *)");
        }
        Consume(&local_190,this);
        Token::~Token(&local_190);
        pTVar1 = (Token *)((long)&loc.field_1 + 8);
        Consume(pTVar1,this);
        ErrorUnlessOpcodeEnabled(this,pTVar1);
        Token::~Token((Token *)((long)&loc.field_1 + 8));
        MakeUnique<wabt::IfExceptExpr,wabt::Location&>((wabt *)&local_38,(Location *)auStack_c8);
        RVar9 = ParseIfExceptHeader(this,local_38);
        RVar10.enum_ = Error;
        if (RVar9.enum_ != Error) {
          bVar7 = PeekMatchExpr(this);
          if (bVar7) {
            piVar2 = &loc.field_1.field_0.last_column;
            loc.field_1._8_8_ = 0;
            cond.first_ = (Expr *)0x0;
            cond.last_ = (Expr *)0x0;
            RVar9 = ParseExpr(this,(ExprList *)piVar2);
            uVar12 = loc.field_1._8_8_;
            if (RVar9.enum_ != Error) {
              expr._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
              super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                   (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
                   (__uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>)0x0;
              _Stack_58._M_head_impl = (Expr *)piVar2;
              intrusive_list<wabt::Expr>::splice
                        (exprs,(int)exprs,(__off64_t *)0x0,(int)piVar2,(__off64_t *)piVar2,
                         loc.field_1._8_8_,(int)piVar2);
              uVar12 = loc.field_1._8_8_;
            }
            while ((long *)uVar12 != (long *)0x0) {
              plVar4 = *(long **)(uVar12 + 8);
              (**(code **)(*(long *)uVar12 + 8))();
              uVar12 = plVar4;
            }
            if (RVar9.enum_ == Error) goto LAB_00f6d643;
          }
          bVar7 = MatchLpar(this,Then);
          if (!bVar7) {
            bVar7 = PeekMatchExpr(this);
            if (bVar7) {
              RVar9 = ParseExpr(this,&(local_38->true_).exprs);
              if (RVar9.enum_ != Error) {
                GetLocation((Location *)((long)&loc.field_1 + 8),this);
                (local_38->true_).end_loc.field_1.field_1.offset = (size_t)cond.last_;
                *(size_t *)((long)&(local_38->true_).end_loc.field_1 + 8) = cond.size_;
                (local_38->true_).end_loc.filename.data_ = (char *)loc.field_1._8_8_;
                (local_38->true_).end_loc.filename.size_ = (size_type)cond.first_;
                bVar7 = PeekMatchExpr(this);
                if (!bVar7) goto LAB_00f6d6be;
                RVar9 = ParseExpr(this,&local_38->false_);
                if (RVar9.enum_ != Error) {
                  GetLocation((Location *)((long)&loc.field_1 + 8),this);
                  goto LAB_00f6d69e;
                }
              }
              goto LAB_00f6d643;
            }
            Match(this,Lpar);
            loc.field_1._8_8_ = &cond.last_;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)((long)&loc.field_1 + 8),"then block","");
            __l_00._M_len = 1;
            __l_00._M_array = (iterator)((long)&loc.field_1 + 8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&stack0xffffffffffffffa8,__l_00,&local_39);
            RVar10 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)&stack0xffffffffffffffa8,"(then ...)");
            goto LAB_00f6d626;
          }
          RVar9 = ParseTerminatingInstrList(this,&(local_38->true_).exprs);
          if (RVar9.enum_ != Error) {
            GetLocation((Location *)((long)&loc.field_1 + 8),this);
            (local_38->true_).end_loc.field_1.field_1.offset = (size_t)cond.last_;
            *(size_t *)((long)&(local_38->true_).end_loc.field_1 + 8) = cond.size_;
            (local_38->true_).end_loc.filename.data_ = (char *)loc.field_1._8_8_;
            (local_38->true_).end_loc.filename.size_ = (size_type)cond.first_;
            RVar9 = Expect(this,Rpar);
            if (RVar9.enum_ != Error) {
              bVar7 = MatchLpar(this,Else);
              if (!bVar7) {
                bVar7 = PeekMatchExpr(this);
                if (bVar7) {
                  RVar9 = ParseExpr(this,&local_38->false_);
                  goto LAB_00f6d68a;
                }
LAB_00f6d68f:
                GetLocation((Location *)((long)&loc.field_1 + 8),this);
LAB_00f6d69e:
                (local_38->false_end_loc).field_1.field_1.offset = (size_t)cond.last_;
                *(size_t *)((long)&(local_38->false_end_loc).field_1 + 8) = cond.size_;
                (local_38->false_end_loc).filename.data_ = (char *)loc.field_1._8_8_;
                (local_38->false_end_loc).filename.size_ = (size_type)cond.first_;
LAB_00f6d6be:
                local_d8._M_head_impl = (Expr *)local_38;
                local_38 = (IfExceptExpr *)0x0;
                intrusive_list<wabt::Expr>::push_back
                          (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 &local_d8);
                if ((IfExceptExpr *)local_d8._M_head_impl != (IfExceptExpr *)0x0) {
                  (*(((ExprMixin<(wabt::ExprType)20> *)&(local_d8._M_head_impl)->_vptr_Expr)->
                    super_Expr)._vptr_Expr[1])();
                }
                local_d8._M_head_impl = (Expr *)0x0;
                goto LAB_00f6d790;
              }
              RVar9 = ParseTerminatingInstrList(this,&local_38->false_);
              if (RVar9.enum_ != Error) {
                RVar9 = Expect(this,Rpar);
LAB_00f6d68a:
                if (RVar9.enum_ != Error) goto LAB_00f6d68f;
              }
            }
          }
        }
        goto LAB_00f6d643;
      }
      Consume(&local_370,this);
      Token::~Token(&local_370);
      Consume(&local_320,this);
      Token::~Token(&local_320);
      MakeUnique<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Location&>
                ((wabt *)(loc.field_1.field2 + 8),(Location *)auStack_c8);
      RVar10 = ParseLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40));
      if ((RVar10.enum_ == Error) ||
         (RVar10 = ParseBlock(this,(Block *)(loc.field_1._8_8_ + 0x40)), uVar12 = loc.field_1._8_8_,
         RVar10.enum_ == Error)) goto LAB_00f6d3d5;
      loc.field_1._8_8_ = 0;
      local_f0._M_head_impl = (Expr *)uVar12;
      intrusive_list<wabt::Expr>::push_back
                (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_f0);
      if (local_f0._M_head_impl != (Expr *)0x0) {
        (*(local_f0._M_head_impl)->_vptr_Expr[1])();
      }
      local_f0._M_head_impl = (Expr *)0x0;
LAB_00f6d41a:
      bVar7 = true;
      uVar12 = loc.field_1._8_8_;
    }
    else {
      if (TVar8 == If) {
        Consume(&local_230,this);
        Token::~Token(&local_230);
        Consume(&local_1e0,this);
        Token::~Token(&local_1e0);
        MakeUnique<wabt::IfExpr,wabt::Location&>((wabt *)&local_38,(Location *)auStack_c8);
        RVar9 = ParseLabelOpt(this,&(local_38->true_).label);
        RVar10.enum_ = Error;
        if ((RVar9.enum_ == Error) ||
           (RVar9 = ParseBlockDeclaration(this,&(local_38->true_).decl), RVar9.enum_ == Error)) {
LAB_00f6d643:
          bVar7 = false;
        }
        else {
          bVar7 = PeekMatchExpr(this);
          if (bVar7) {
            piVar2 = &loc.field_1.field_0.last_column;
            loc.field_1._8_8_ = 0;
            cond.first_ = (Expr *)0x0;
            cond.last_ = (Expr *)0x0;
            RVar9 = ParseExpr(this,(ExprList *)piVar2);
            uVar12 = loc.field_1._8_8_;
            if (RVar9.enum_ != Error) {
              expr._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
              super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                   (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
                   (__uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>)0x0;
              _Stack_58._M_head_impl = (Expr *)piVar2;
              intrusive_list<wabt::Expr>::splice
                        (exprs,(int)exprs,(__off64_t *)0x0,(int)piVar2,(__off64_t *)piVar2,
                         loc.field_1._8_8_,(int)piVar2);
              uVar12 = loc.field_1._8_8_;
            }
            while ((long *)uVar12 != (long *)0x0) {
              plVar4 = *(long **)(uVar12 + 8);
              (**(code **)(*(long *)uVar12 + 8))();
              uVar12 = plVar4;
            }
            if (RVar9.enum_ == Error) goto LAB_00f6d643;
          }
          bVar7 = MatchLpar(this,Then);
          if (!bVar7) {
            bVar7 = PeekMatchExpr(this);
            if (bVar7) {
              RVar9 = ParseExpr(this,&(local_38->true_).exprs);
              if (RVar9.enum_ != Error) {
                GetLocation((Location *)((long)&loc.field_1 + 8),this);
                (local_38->true_).end_loc.field_1.field_1.offset = (size_t)cond.last_;
                *(size_t *)((long)&(local_38->true_).end_loc.field_1 + 8) = cond.size_;
                (local_38->true_).end_loc.filename.data_ = (char *)loc.field_1._8_8_;
                (local_38->true_).end_loc.filename.size_ = (size_type)cond.first_;
                bVar7 = PeekMatchExpr(this);
                if (!bVar7) goto LAB_00f6d754;
                RVar9 = ParseExpr(this,&local_38->false_);
                if (RVar9.enum_ != Error) {
                  GetLocation((Location *)((long)&loc.field_1 + 8),this);
                  goto LAB_00f6d734;
                }
              }
            }
            else {
              Match(this,Lpar);
              loc.field_1._8_8_ = &cond.last_;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)((long)&loc.field_1 + 8),"then block","");
              __l_01._M_len = 1;
              __l_01._M_array = (iterator)((long)&loc.field_1 + 8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&stack0xffffffffffffffa8,__l_01,&local_39);
              RVar10 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           *)&stack0xffffffffffffffa8,"(then ...)");
LAB_00f6d626:
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&stack0xffffffffffffffa8);
              if ((Expr **)loc.field_1._8_8_ != &cond.last_) {
                operator_delete((void *)loc.field_1._8_8_);
              }
            }
            goto LAB_00f6d643;
          }
          RVar9 = ParseTerminatingInstrList(this,&(local_38->true_).exprs);
          if (RVar9.enum_ == Error) goto LAB_00f6d643;
          GetLocation((Location *)((long)&loc.field_1 + 8),this);
          (local_38->true_).end_loc.field_1.field_1.offset = (size_t)cond.last_;
          *(size_t *)((long)&(local_38->true_).end_loc.field_1 + 8) = cond.size_;
          (local_38->true_).end_loc.filename.data_ = (char *)loc.field_1._8_8_;
          (local_38->true_).end_loc.filename.size_ = (size_type)cond.first_;
          RVar9 = Expect(this,Rpar);
          if (RVar9.enum_ == Error) goto LAB_00f6d643;
          bVar7 = MatchLpar(this,Else);
          if (bVar7) {
            RVar9 = ParseTerminatingInstrList(this,&local_38->false_);
            if (RVar9.enum_ != Error) {
              RVar9 = Expect(this,Rpar);
              goto LAB_00f6d71c;
            }
            goto LAB_00f6d643;
          }
          bVar7 = PeekMatchExpr(this);
          if (bVar7) {
            RVar9 = ParseExpr(this,&local_38->false_);
LAB_00f6d71c:
            if (RVar9.enum_ == Error) goto LAB_00f6d643;
          }
          GetLocation((Location *)((long)&loc.field_1 + 8),this);
LAB_00f6d734:
          (local_38->false_end_loc).field_1.field_1.offset = (size_t)cond.last_;
          *(size_t *)((long)&(local_38->false_end_loc).field_1 + 8) = cond.size_;
          (local_38->false_end_loc).filename.data_ = (char *)loc.field_1._8_8_;
          (local_38->false_end_loc).filename.size_ = (size_type)cond.first_;
LAB_00f6d754:
          local_e0._M_head_impl = (Expr *)local_38;
          local_38 = (IfExceptExpr *)0x0;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_e0);
          if ((IfExceptExpr *)local_e0._M_head_impl != (IfExceptExpr *)0x0) {
            (*(((ExprMixin<(wabt::ExprType)20> *)&(local_e0._M_head_impl)->_vptr_Expr)->super_Expr).
              _vptr_Expr[1])();
          }
          local_e0._M_head_impl = (Expr *)0x0;
LAB_00f6d790:
          RVar10.enum_ = Error;
          bVar7 = true;
        }
        if (local_38 != (IfExceptExpr *)0x0) {
          (*(local_38->super_ExprMixin<(wabt::ExprType)20>).super_Expr._vptr_Expr[1])();
        }
        goto joined_r0x00f6d658;
      }
      if (TVar8 == Loop) {
        Consume(&local_2d0,this);
        Token::~Token(&local_2d0);
        Consume(&local_280,this);
        Token::~Token(&local_280);
        MakeUnique<wabt::BlockExprBase<(wabt::ExprType)22>,wabt::Location&>
                  ((wabt *)(loc.field_1.field2 + 8),(Location *)auStack_c8);
        RVar10 = ParseLabelOpt(this,(string *)(loc.field_1._8_8_ + 0x40));
        if ((RVar10.enum_ != Error) &&
           (RVar10 = ParseBlock(this,(Block *)(loc.field_1._8_8_ + 0x40)),
           uVar12 = loc.field_1._8_8_, RVar10.enum_ != Error)) {
          loc.field_1._8_8_ = 0;
          local_e8._M_head_impl = (Expr *)uVar12;
          intrusive_list<wabt::Expr>::push_back
                    (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_e8);
          if (local_e8._M_head_impl != (Expr *)0x0) {
            (*(local_e8._M_head_impl)->_vptr_Expr[1])();
          }
          local_e8._M_head_impl = (Expr *)0x0;
          goto LAB_00f6d41a;
        }
LAB_00f6d3d5:
        bVar7 = false;
        uVar12 = loc.field_1._8_8_;
      }
      else {
        if (TVar8 != Try) goto LAB_00f6d7f9;
        Consume(&local_140,this);
        Token::~Token(&local_140);
        pTVar1 = (Token *)((long)&loc.field_1 + 8);
        Consume(pTVar1,this);
        ErrorUnlessOpcodeEnabled(this,pTVar1);
        Token::~Token((Token *)((long)&loc.field_1 + 8));
        MakeUnique<wabt::TryExpr,wabt::Location&>
                  ((wabt *)&stack0xffffffffffffffa8,(Location *)auStack_c8);
        RVar10 = ParseLabelOpt(this,(string *)(_Stack_58._M_head_impl + 1));
        if (((RVar10.enum_ != Error) &&
            (RVar10 = ParseBlockDeclaration
                                (this,(BlockDeclaration *)
                                      &_Stack_58._M_head_impl[1].loc.filename.size_),
            RVar10.enum_ != Error)) &&
           (RVar10 = ParseInstrList(this,(ExprList *)((long)_Stack_58._M_head_impl + 0xe0)),
           RVar10.enum_ != Error)) {
          GetLocation((Location *)((long)&loc.field_1 + 8),this);
          ((_Stack_58._M_head_impl + 0x100)->super_intrusive_list_base<wabt::Expr>).next_ =
               cond.last_;
          ((_Stack_58._M_head_impl + 0x100)->super_intrusive_list_base<wabt::Expr>).prev_ =
               (Expr *)cond.size_;
          *(undefined8 *)&(_Stack_58._M_head_impl + 0xc0)->type_ = loc.field_1._8_8_;
          (_Stack_58._M_head_impl + 0x100)->_vptr_Expr = (_func_int **)cond.first_;
          RVar10 = Expect(this,Lpar);
          if (((RVar10.enum_ != Error) && (RVar10 = Expect(this,Catch), RVar10.enum_ != Error)) &&
             ((RVar10 = ParseTerminatingInstrList
                                  (this,(ExprList *)&(_Stack_58._M_head_impl + 0x100)->loc),
              RVar10.enum_ != Error &&
              (RVar10 = Expect(this,Rpar),
              uVar6._M_t.super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
              super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl =
                   (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
                   (__uniq_ptr_data<wabt::Expr,_std::default_delete<wabt::Expr>,_true,_true>)
                   _Stack_58._M_head_impl, RVar10.enum_ != Error)))) {
            _Stack_58._M_head_impl = (Expr *)0x0;
            local_d0._M_head_impl =
                 (Expr *)uVar6._M_t.
                         super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
                         super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
                         super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
            intrusive_list<wabt::Expr>::push_back
                      (exprs,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_d0);
            if (local_d0._M_head_impl != (Expr *)0x0) {
              (*(local_d0._M_head_impl)->_vptr_Expr[1])();
            }
            local_d0._M_head_impl = (Expr *)0x0;
            bVar7 = true;
            uVar12 = _Stack_58._M_head_impl;
            goto LAB_00f6d424;
          }
        }
        bVar7 = false;
        uVar12 = _Stack_58._M_head_impl;
      }
    }
LAB_00f6d424:
    if ((_Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>)uVar12 != (Expr *)0x0) {
      (**(code **)(*(long *)uVar12 + 8))();
    }
    RVar10.enum_ = Error;
    goto joined_r0x00f6d658;
  }
  Consume(&local_3c0,this);
  Token::~Token(&local_3c0);
  _Stack_58._M_head_impl = (Expr *)0x0;
  RVar9 = ParsePlainInstr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                               &stack0xffffffffffffffa8);
  if ((RVar9.enum_ == Error) || (RVar9 = ParseExprList(this,exprs), RVar9.enum_ == Error)) {
LAB_00f6ccf9:
    bVar7 = false;
  }
  else {
    loc.field_1._8_8_ = &cond.last_;
    std::__cxx11::string::_M_construct<char_const*>((string *)((long)&loc.field_1 + 8),"an expr","")
    ;
    __l._M_len = 1;
    __l._M_array = (iterator)((long)&loc.field_1 + 8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)auStack_c8,__l,(allocator_type *)&local_38);
    RVar9 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)auStack_c8,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_c8);
    if ((Expr **)loc.field_1._8_8_ != &cond.last_) {
      operator_delete((void *)loc.field_1._8_8_);
    }
    _Var5._M_head_impl = _Stack_58._M_head_impl;
    if (RVar9.enum_ == Error) goto LAB_00f6ccf9;
    _Stack_58._M_head_impl = (Expr *)0x0;
    if ((((_Var5._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ != (Expr *)0x0) ||
       (((_Var5._M_head_impl)->super_intrusive_list_base<wabt::Expr>).next_ != (Expr *)0x0)) {
      __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/intrusive-list.h"
                    ,0x1bf,
                    "void wabt::intrusive_list<wabt::Expr>::push_back(std::unique_ptr<T>) [T = wabt::Expr]"
                   );
    }
    pEVar3 = exprs->last_;
    pEVar11 = exprs;
    if (pEVar3 != (Expr *)0x0) {
      ((_Var5._M_head_impl)->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar3;
      pEVar11 = (ExprList *)&pEVar3->super_intrusive_list_base<wabt::Expr>;
    }
    pEVar11->first_ = _Var5._M_head_impl;
    exprs->last_ = _Var5._M_head_impl;
    exprs->size_ = exprs->size_ + 1;
    bVar7 = true;
  }
  if (_Stack_58._M_head_impl != (Expr *)0x0) {
    (*(_Stack_58._M_head_impl)->_vptr_Expr[1])();
  }
joined_r0x00f6d658:
  if (bVar7) {
    RVar10 = Expect(this,Rpar);
    RVar10.enum_ = (Enum)(RVar10.enum_ == Error);
  }
  return (Result)RVar10.enum_;
}

Assistant:

Result WastParser::ParseExpr(ExprList* exprs) {
  WABT_TRACE(ParseExpr);
  if (!PeekMatch(TokenType::Lpar)) {
    return Result::Error;
  }

  if (IsPlainInstr(Peek(1))) {
    Consume();
    std::unique_ptr<Expr> expr;
    CHECK_RESULT(ParsePlainInstr(&expr));
    CHECK_RESULT(ParseExprList(exprs));
    CHECK_RESULT(ErrorIfLpar({"an expr"}));
    exprs->push_back(std::move(expr));
  } else {
    Location loc = GetLocation();

    switch (Peek(1)) {
      case TokenType::Block: {
        Consume();
        Consume();
        auto expr = MakeUnique<BlockExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Loop: {
        Consume();
        Consume();
        auto expr = MakeUnique<LoopExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlock(&expr->block));
        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::If: {
        Consume();
        Consume();
        auto expr = MakeUnique<IfExpr>(loc);

        CHECK_RESULT(ParseLabelOpt(&expr->true_.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->true_.decl));

        if (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        if (MatchLpar(TokenType::Then)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          EXPECT(Rpar);

          if (MatchLpar(TokenType::Else)) {
            CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
            EXPECT(Rpar);
          } else if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
          }
          expr->false_end_loc = GetLocation();
        } else if (PeekMatchExpr()) {
          CHECK_RESULT(ParseExpr(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
            expr->false_end_loc = GetLocation();
          }
        } else {
          ConsumeIfLpar();
          return ErrorExpected({"then block"}, "(then ...)");
        }

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::IfExcept: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());
        auto expr = MakeUnique<IfExceptExpr>(loc);

        CHECK_RESULT(ParseIfExceptHeader(expr.get()));

        if (PeekMatchExpr()) {
          ExprList cond;
          CHECK_RESULT(ParseExpr(&cond));
          exprs->splice(exprs->end(), cond);
        }

        if (MatchLpar(TokenType::Then)) {
          CHECK_RESULT(ParseTerminatingInstrList(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          EXPECT(Rpar);

          if (MatchLpar(TokenType::Else)) {
            CHECK_RESULT(ParseTerminatingInstrList(&expr->false_));
            EXPECT(Rpar);
          } else if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
          }
          expr->false_end_loc = GetLocation();
        } else if (PeekMatchExpr()) {
          CHECK_RESULT(ParseExpr(&expr->true_.exprs));
          expr->true_.end_loc = GetLocation();
          if (PeekMatchExpr()) {
            CHECK_RESULT(ParseExpr(&expr->false_));
            expr->false_end_loc = GetLocation();
          }
        } else {
          ConsumeIfLpar();
          return ErrorExpected({"then block"}, "(then ...)");
        }

        exprs->push_back(std::move(expr));
        break;
      }

      case TokenType::Try: {
        Consume();
        ErrorUnlessOpcodeEnabled(Consume());

        auto expr = MakeUnique<TryExpr>(loc);
        CHECK_RESULT(ParseLabelOpt(&expr->block.label));
        CHECK_RESULT(ParseBlockDeclaration(&expr->block.decl));
        CHECK_RESULT(ParseInstrList(&expr->block.exprs));
        expr->block.end_loc = GetLocation();
        EXPECT(Lpar);
        EXPECT(Catch);
        CHECK_RESULT(ParseTerminatingInstrList(&expr->catch_));
        EXPECT(Rpar);
        exprs->push_back(std::move(expr));
        break;
      }

      default:
        assert(!"ParseExpr should only be called when IsExpr() is true");
        return Result::Error;
    }
  }

  EXPECT(Rpar);
  return Result::Ok;
}